

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,sockaddr*&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,sockaddr **params_1,uint *params_2,ReaderOptions *params_3)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Impl *this_00;
  Impl *extraout_RDX;
  Own<capnp::EzRpcServer::Impl> OVar3;
  ReaderOptions readerOpts;
  Own<capnp::ClientHook> local_48;
  
  this_00 = (Impl *)operator_new(0x98);
  local_48.disposer = (params->hook).disposer;
  local_48.ptr = (params->hook).ptr;
  (params->hook).ptr = (ClientHook *)0x0;
  uVar1 = params_3->traversalLimitInWords;
  uVar2 = params_3->nestingLimit;
  readerOpts.nestingLimit = uVar2;
  readerOpts.traversalLimitInWords = uVar1;
  readerOpts._12_4_ = 0;
  capnp::EzRpcServer::Impl::Impl(this_00,(Client *)&local_48,*params_1,*params_2,readerOpts);
  *(undefined8 **)this = &_::HeapDisposer<capnp::EzRpcServer::Impl>::instance;
  *(Impl **)(this + 8) = this_00;
  Own<capnp::ClientHook>::dispose(&local_48);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}